

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O1

void __thiscall Nes_Triangle::run(Nes_Triangle *this,nes_time_t time,nes_time_t end_time)

{
  Blip_Buffer *pBVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  iVar2 = ((this->super_Nes_Osc).regs[3] & 7) * 0x100;
  uVar4 = (uint)(this->super_Nes_Osc).regs[2];
  uVar7 = iVar2 + uVar4;
  iVar2 = iVar2 + uVar4 + 1;
  pBVar1 = (this->super_Nes_Osc).output;
  if (pBVar1 == (Blip_Buffer *)0x0) {
    iVar6 = time + (this->super_Nes_Osc).delay;
    (this->super_Nes_Osc).delay = 0;
    if ((this->super_Nes_Osc).length_counter == 0) {
      return;
    }
    if (uVar7 < 2) {
      return;
    }
    if (this->linear_counter == 0) {
      return;
    }
    if (end_time - iVar6 != 0 && iVar6 <= end_time) {
      iVar3 = (int)((end_time - iVar6) + uVar7) / iVar2;
      this->phase = ((this->phase - iVar3) + 1U & 0x1f) + 1;
      iVar6 = iVar6 + iVar3 * iVar2;
    }
  }
  else {
    pBVar1->modified_ = 1;
    iVar6 = (this->super_Nes_Osc).last_amp;
    iVar3 = this->phase;
    iVar5 = iVar3 + -0x11;
    if (iVar3 < 0x11) {
      iVar5 = 0x10 - iVar3;
    }
    (this->super_Nes_Osc).last_amp = iVar5;
    iVar5 = iVar5 - iVar6;
    if (iVar5 != 0) {
      Blip_Synth<8,_1>::offset(&this->synth,time,iVar5,pBVar1);
    }
    iVar6 = end_time;
    if (((((this->super_Nes_Osc).length_counter != 0) && (1 < uVar7)) && (this->linear_counter != 0)
        ) && (iVar6 = time + (this->super_Nes_Osc).delay, iVar6 < end_time)) {
      pBVar1 = (this->super_Nes_Osc).output;
      iVar3 = this->phase;
      iVar5 = iVar3 + -0x10;
      if (iVar3 < 0x11) {
        iVar5 = iVar3;
      }
      uVar7 = (uint)(iVar3 < 0x11) * 2 - 1;
      do {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          uVar7 = -uVar7;
          iVar5 = 0x10;
        }
        else {
          Blip_Synth<8,_1>::offset_inline(&this->synth,iVar6,uVar7,pBVar1);
        }
        iVar6 = iVar6 + iVar2;
      } while (iVar6 < end_time);
      uVar7 = uVar7 >> 0x1b & 0xfffffff0;
      iVar3 = uVar7 + iVar5;
      this->phase = iVar3;
      iVar2 = (uVar7 - 0x11) + iVar5;
      if (iVar3 < 0x11) {
        iVar2 = 0x10 - iVar3;
      }
      (this->super_Nes_Osc).last_amp = iVar2;
    }
  }
  (this->super_Nes_Osc).delay = iVar6 - end_time;
  return;
}

Assistant:

void Nes_Triangle::run( nes_time_t time, nes_time_t end_time )
{
	const int timer_period = period() + 1;
	if ( !output )
	{
		time += delay;
		delay = 0;
		if ( length_counter && linear_counter && timer_period >= 3 )
			delay = maintain_phase( time, end_time, timer_period ) - end_time;
		return;
	}
	
	output->set_modified();
	
	// to do: track phase when period < 3
	// to do: Output 7.5 on dac when period < 2? More accurate, but results in more clicks.
	
	int delta = update_amp( calc_amp() );
	if ( delta )
		synth.offset( time, delta, output );
	
	time += delay;
	if ( length_counter == 0 || linear_counter == 0 || timer_period < 3 )
	{
		time = end_time;
	}
	else if ( time < end_time )
	{
		Blip_Buffer* const output = this->output;
		
		int phase = this->phase;
		int volume = 1;
		if ( phase > phase_range ) {
			phase -= phase_range;
			volume = -volume;
		}
		
		do {
			if ( --phase == 0 ) {
				phase = phase_range;
				volume = -volume;
			}
			else {
				synth.offset_inline( time, volume, output );
			}
			
			time += timer_period;
		}
		while ( time < end_time );
		
		if ( volume < 0 )
			phase += phase_range;
		this->phase = phase;
		last_amp = calc_amp();
 	}
	delay = time - end_time;
}